

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

bool SeedTest<Blob<128>>(pfHash hash,int keycount,bool drawDiagram)

{
  undefined4 uVar1;
  char *pcVar2;
  bool bVar3;
  size_t sVar4;
  reference pvVar5;
  byte in_DL;
  uint in_ESI;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> *in_RDI;
  bool result;
  int i;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> hashes;
  int len;
  char *text;
  bool in_stack_0000007b;
  bool in_stack_0000007c;
  bool in_stack_0000007d;
  bool in_stack_0000007e;
  bool in_stack_0000007f;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> *in_stack_00000080;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> *in_stack_ffffffffffffffa0;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> *__new_size;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  byte bVar6;
  int local_48;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> local_38;
  undefined4 local_1c;
  char *local_18;
  byte local_d;
  uint local_c;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> *local_8;
  
  local_d = in_DL & 1;
  local_c = in_ESI;
  local_8 = in_RDI;
  printf("Keyset \'Seed\' - %d keys\n",(ulong)in_ESI);
  local_18 = "The quick brown fox jumps over the lazy dog";
  sVar4 = strlen("The quick brown fox jumps over the lazy dog");
  local_1c = (undefined4)sVar4;
  __new_size = &local_38;
  std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::vector
            ((vector<Blob<128>,_std::allocator<Blob<128>_>_> *)0x162d70);
  std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::resize
            ((vector<Blob<128>,_std::allocator<Blob<128>_>_> *)
             CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),(size_type)__new_size);
  for (local_48 = 0; pcVar2 = local_18, uVar1 = local_1c, local_48 < (int)local_c;
      local_48 = local_48 + 1) {
    in_stack_ffffffffffffffa0 = local_8;
    pvVar5 = std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::operator[]
                       (&local_38,(long)local_48);
    (*(code *)in_stack_ffffffffffffffa0)(pcVar2,uVar1,local_48,pvVar5);
  }
  bVar6 = 1;
  bVar3 = TestHashList<Blob<128>>
                    (in_stack_00000080,in_stack_0000007f,in_stack_0000007e,in_stack_0000007d,
                     in_stack_0000007c,in_stack_0000007b);
  bVar6 = bVar3 & bVar6;
  printf("\n");
  std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::~vector(in_stack_ffffffffffffffa0);
  return (bool)(bVar6 & 1);
}

Assistant:

bool SeedTest ( pfHash hash, int keycount, bool drawDiagram )
{
  printf("Keyset 'Seed' - %d keys\n",keycount);

  const char * text = "The quick brown fox jumps over the lazy dog";
  const int len = (int)strlen(text);

  //----------

  std::vector<hashtype> hashes;

  hashes.resize(keycount);

  for(int i = 0; i < keycount; i++)
  {
    hash(text,len,i,&hashes[i]);
  }

  bool result = true;

  result &= TestHashList(hashes,drawDiagram);

  printf("\n");

  return result;
}